

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KrazyMeans.cpp
# Opt level: O1

void __thiscall KrazyMeans::dumpLabels(KrazyMeans *this,string *file_name)

{
  element_type *peVar1;
  ulong uVar2;
  long lVar3;
  ofstream file;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228,(string *)file_name,_S_bin);
  peVar1 = (this->data_set).super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (*(pointer *)
       ((long)&(peVar1->vectors).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl
               .super__Vector_impl_data + 8) !=
      (peVar1->vectors).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      std::ostream::write((char *)&local_228,
                          (long)(this->labels).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar3);
      uVar2 = uVar2 + 1;
      peVar1 = (this->data_set).super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar3 = lVar3 + 8;
    } while (uVar2 < (ulong)(((long)*(pointer *)
                                     ((long)&(peVar1->vectors).
                                             super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>
                                             ._M_impl.super__Vector_impl_data + 8) -
                              (long)(peVar1->vectors).
                                    super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void KrazyMeans::dumpLabels(std::string file_name) {
  std::ofstream file(file_name, std::ios::binary);

  // Write labels as uint16_t
  for (size_t v = 0; v < data_set->size(); v++) {
    file.write((char *) &labels[v], sizeof(size_t));
  }
}